

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeObjectPrototype
               (DynamicObject *objectPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  byte bVar1;
  RuntimeFunction *pRVar2;
  JavascriptMethod entryPoint;
  
  this = (((objectPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  DeferredTypeHandlerBase::Convert(typeHandler,objectPrototype,mode,0xb,1);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (objectPrototype,0x67,(this->super_JavascriptLibraryBase).objectConstructor.ptr,6,0,0,0)
  ;
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::HasOwnProperty,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xb7);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0xb7,pRVar2,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x878);
  *(RuntimeFunction **)&this->field_0x878 = pRVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x878);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::PropertyIsEnumerable,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x123);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0x123,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::IsPrototypeOf,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xc5);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0xc5,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::ToLocaleString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x172);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0x172,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::ToString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x178);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0x178,pRVar2,6,0,0,0);
  Memory::Recycler::WBSetBit((char *)&this->objectToStringFunction);
  (this->objectToStringFunction).ptr = &pRVar2->super_JavascriptFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->objectToStringFunction);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::ValueOf,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x18e);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0x18e,pRVar2,6,0,0,0);
  Memory::Recycler::WBSetBit((char *)&this->objectValueOfFunction);
  (this->objectValueOfFunction).ptr = &pRVar2->super_JavascriptFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->objectValueOfFunction);
  entryPoint = FunctionInfo::GetOriginalEntryPoint
                         ((FunctionInfo *)JavascriptObject::EntryInfo::ToString);
  ScriptContext::SetBuiltInLibraryFunction(this_00,entryPoint,(this->objectToStringFunction).ptr);
  bVar1 = DynamicTypeHandler::GetPropertyTypes
                    (*(DynamicTypeHandler **)
                      ((objectPrototype->super_RecyclableObject).type.ptr + 1));
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])
            (objectPrototype,0x1eb,(this->super_JavascriptLibraryBase).__proto__getterFunction.ptr);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3d])(objectPrototype,0x1eb,0);
  if ((bVar1 & 0x10) != 0) {
    DynamicTypeHandler::SetHasOnlyWritableDataProperties
              (*(DynamicTypeHandler **)((objectPrototype->super_RecyclableObject).type.ptr + 1),true
              );
  }
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::DefineGetter,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x1e7);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0x1e7,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::DefineSetter,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x1e8);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0x1e8,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::LookupGetter,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x1e9);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0x1e9,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptObject::EntryInfo::LookupSetter,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x1ea);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(objectPrototype,0x1ea,pRVar2,6,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(objectPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeObjectPrototype(DynamicObject* objectPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = objectPrototype->GetLibrary();
        ScriptContext* scriptContext = objectPrototype->GetScriptContext();
        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        typeHandler->Convert(objectPrototype, mode, 11, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterObject
        // so that the update is in sync with profiler
        library->AddMember(objectPrototype, PropertyIds::constructor, library->objectConstructor);
        builtinFuncs[BuiltinFunction::JavascriptObject_HasOwnProperty] = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::hasOwnProperty, &JavascriptObject::EntryInfo::HasOwnProperty, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::propertyIsEnumerable, &JavascriptObject::EntryInfo::PropertyIsEnumerable, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::isPrototypeOf, &JavascriptObject::EntryInfo::IsPrototypeOf, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::toLocaleString, &JavascriptObject::EntryInfo::ToLocaleString, 0);

        library->objectToStringFunction = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::toString, &JavascriptObject::EntryInfo::ToString, 0);
        library->objectValueOfFunction = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::valueOf, &JavascriptObject::EntryInfo::ValueOf, 0);

        scriptContext->SetBuiltInLibraryFunction(JavascriptObject::EntryInfo::ToString.GetOriginalEntryPoint(), library->objectToStringFunction);

        bool hadOnlyWritableDataProperties = objectPrototype->GetDynamicType()->GetTypeHandler()->GetHasOnlyWritableDataProperties();
        objectPrototype->SetAccessors(PropertyIds::__proto__, library->Get__proto__getterFunction(), library->Get__proto__setterFunction(), PropertyOperation_NonFixedValue);
        objectPrototype->SetEnumerable(PropertyIds::__proto__, FALSE);
        // Let's pretend __proto__ is actually writable.  We'll make sure we always go through a special code path when writing to it.
        if (hadOnlyWritableDataProperties)
        {
            objectPrototype->GetDynamicType()->GetTypeHandler()->SetHasOnlyWritableDataProperties();
        }

        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__defineGetter__, &JavascriptObject::EntryInfo::DefineGetter, 2);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__defineSetter__, &JavascriptObject::EntryInfo::DefineSetter, 2);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__lookupGetter__, &JavascriptObject::EntryInfo::LookupGetter, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__lookupSetter__, &JavascriptObject::EntryInfo::LookupSetter, 1);

        objectPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }